

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmConfigureFileCommand.h
# Opt level: O0

cmCommand * __thiscall cmConfigureFileCommand::Clone(cmConfigureFileCommand *this)

{
  cmConfigureFileCommand *this_00;
  cmConfigureFileCommand *this_local;
  
  this_00 = (cmConfigureFileCommand *)operator_new(0xa0);
  cmConfigureFileCommand(this_00);
  return &this_00->super_cmCommand;
}

Assistant:

virtual cmCommand* Clone()
    {
      return new cmConfigureFileCommand;
    }